

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

void __thiscall Command::Command(Command *this,string *cmd,char *extraArgs)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string((string *)this,cmd);
  std::__cxx11::string::string((string *)&this->cmd_,cmd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->extraArgs_,extraArgs,&local_19);
  this->includeFiles_ = false;
  return;
}

Assistant:

Command(std::string cmd, const char *extraArgs)
      : cmd_id_(cmd), cmd_(cmd), extraArgs_(extraArgs) {}